

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O0

bool __thiscall DIS::VariableParameter::operator==(VariableParameter *this,VariableParameter *rhs)

{
  bool local_19;
  bool ivarsEqual;
  VariableParameter *rhs_local;
  VariableParameter *this_local;
  
  local_19 = this->_recordType == rhs->_recordType;
  if ((this->_variableParameterFields1 != rhs->_variableParameterFields1) ||
     (NAN(this->_variableParameterFields1) || NAN(rhs->_variableParameterFields1))) {
    local_19 = false;
  }
  if (this->_variableParameterFields2 != rhs->_variableParameterFields2) {
    local_19 = false;
  }
  if (this->_variableParameterFields3 != rhs->_variableParameterFields3) {
    local_19 = false;
  }
  if (this->_variableParameterFields4 != rhs->_variableParameterFields4) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool VariableParameter::operator ==(const VariableParameter& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_variableParameterFields1 == rhs._variableParameterFields1) ) ivarsEqual = false;
     if( ! (_variableParameterFields2 == rhs._variableParameterFields2) ) ivarsEqual = false;
     if( ! (_variableParameterFields3 == rhs._variableParameterFields3) ) ivarsEqual = false;
     if( ! (_variableParameterFields4 == rhs._variableParameterFields4) ) ivarsEqual = false;

    return ivarsEqual;
 }